

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v7::detail::int_writer<fmt::v7::detail::buffer_appender<char>,_char,_unsigned___int128>::on_num
          (int_writer<fmt::v7::detail::buffer_appender<char>,_char,_unsigned___int128> *this)

{
  unsigned___int128 *puVar1;
  char *pcVar2;
  char cVar3;
  byte bVar4;
  basic_format_specs<char> *pbVar5;
  undefined1 auVar6 [16];
  unsigned___int128 uVar7;
  char cVar8;
  uint uVar9;
  buffer_appender<char> bVar10;
  int iVar11;
  _Alloc_hider _Var12;
  ulong uVar13;
  char *pcVar14;
  int iVar15;
  size_type sVar16;
  ulong uVar17;
  char *pcVar18;
  ulong uVar19;
  ulong uVar20;
  buffer<char> *buf;
  long lVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  string groups;
  char digits [40];
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> buffer;
  string local_298;
  char local_278 [48];
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> local_248;
  
  grouping_impl<char>(&local_298,(locale_ref)(this->locale).locale_);
  if (local_298._M_string_length == 0) {
    on_dec(this);
    goto LAB_001a08ad;
  }
  cVar8 = thousands_sep_impl<char>((locale_ref)(this->locale).locale_);
  if (cVar8 == '\0') {
    on_dec(this);
    goto LAB_001a08ad;
  }
  puVar1 = &this->abs_value;
  uVar7 = *puVar1;
  uVar20 = *(ulong *)((long)&this->abs_value + 8);
  auVar6 = (undefined1  [16])*puVar1;
  auVar23 = (undefined1  [16])*puVar1;
  uVar13 = 1;
  if (((ulong)uVar7 < 10) <= uVar20) {
    uVar13 = 4;
    auVar22 = auVar23;
    do {
      uVar17 = auVar22._8_8_;
      uVar19 = auVar22._0_8_;
      iVar11 = (int)uVar13;
      if (uVar17 == 0 && (ulong)(99 < uVar19) <= -uVar17) {
        uVar13 = (ulong)(iVar11 - 2);
        goto LAB_001a0606;
      }
      if (uVar17 == 0 && (ulong)(999 < uVar19) <= -uVar17) {
        uVar13 = (ulong)(iVar11 - 1);
        goto LAB_001a0606;
      }
      if (uVar17 < (uVar19 < 10000)) goto LAB_001a0606;
      auVar22 = __udivti3(uVar19,uVar17,10000,0);
      uVar13 = (ulong)(iVar11 + 4);
    } while (uVar17 != 0 || -uVar17 < (ulong)(99999 < uVar19));
    uVar13 = (ulong)(iVar11 + 1);
  }
LAB_001a0606:
  iVar11 = (int)uVar13;
  _Var12._M_p = local_298._M_dataplus._M_p;
  uVar17 = uVar13;
  uVar19 = uVar13;
  if (local_298._M_string_length == 0) {
LAB_001a064d:
    iVar15 = (int)uVar19;
    uVar9 = (uint)uVar17;
    if (_Var12._M_p == local_298._M_dataplus._M_p + local_298._M_string_length) goto LAB_001a0658;
  }
  else {
    iVar15 = iVar11 + (int)local_298._M_string_length;
    sVar16 = local_298._M_string_length;
    do {
      cVar3 = *_Var12._M_p;
      uVar9 = (int)uVar17 - (int)cVar3;
      if ((uVar9 == 0 || (int)uVar17 < (int)cVar3) || ((byte)(cVar3 + 0x81U) < 0x82))
      goto LAB_001a064d;
      uVar19 = (ulong)((int)uVar19 + 1);
      _Var12._M_p = _Var12._M_p + 1;
      uVar17 = (ulong)uVar9;
      sVar16 = sVar16 - 1;
    } while (sVar16 != 0);
LAB_001a0658:
    iVar15 = (int)(uVar9 - 1) / (int)(local_298._M_dataplus._M_p + local_298._M_string_length)[-1] +
             iVar15;
  }
  pcVar14 = local_278 + iVar11;
  pcVar18 = pcVar14;
  if (((ulong)uVar7 < 100) <= uVar20) {
    do {
      lVar21 = auVar23._8_8_;
      uVar20 = auVar23._0_8_;
      pcVar14 = pcVar18 + -2;
      auVar23 = __udivti3(uVar20,lVar21,100,0);
      *(undefined2 *)(pcVar18 + -2) =
           *(undefined2 *)(basic_data<void>::digits + (uVar20 + auVar23._0_8_ * -100) * 2);
      pcVar18 = pcVar14;
      auVar6 = auVar23;
    } while (lVar21 != 0 || (ulong)-lVar21 < (ulong)(9999 < uVar20));
  }
  if (auVar6._8_8_ == 0 && (ulong)(9 < auVar6._0_8_) <= (ulong)-auVar6._8_8_) {
    pcVar14[-1] = auVar6[0] | 0x30;
  }
  else {
    *(undefined2 *)(pcVar14 + -2) = *(undefined2 *)(basic_data<void>::digits + auVar6._0_8_ * 2);
  }
  local_248.super_buffer<char>.size_ = 0;
  local_248.super_buffer<char>._vptr_buffer = (_func_int **)&PTR_grow_0032bde0;
  local_248.super_buffer<char>.ptr_ = local_248.store_;
  local_248.super_buffer<char>.capacity_ = 500;
  uVar9 = iVar15 + this->prefix_size;
  uVar20 = (ulong)uVar9;
  if (500 < uVar9) {
    basic_memory_buffer<char,_500UL,_std::allocator<char>_>::grow(&local_248,uVar20);
  }
  pcVar14 = local_248.super_buffer<char>.ptr_;
  local_248.super_buffer<char>.size_ = local_248.super_buffer<char>.capacity_;
  if (uVar20 <= local_248.super_buffer<char>.capacity_) {
    local_248.super_buffer<char>.size_ = uVar20;
  }
  pcVar18 = local_248.super_buffer<char>.ptr_ + (long)(int)uVar9 + -1;
  if (1 < iVar11) {
    uVar13 = uVar13 + 1;
    iVar11 = 0;
    _Var12._M_p = local_298._M_dataplus._M_p;
    do {
      pcVar2 = pcVar18 + -1;
      *pcVar18 = local_278[uVar13 - 2];
      cVar3 = *_Var12._M_p;
      if ('\0' < cVar3) {
        iVar11 = iVar11 + 1;
        if ((cVar3 != '\x7f') && (iVar11 % (int)cVar3 == 0)) {
          if (_Var12._M_p + 1 != local_298._M_dataplus._M_p + local_298._M_string_length) {
            iVar11 = 0;
            _Var12._M_p = _Var12._M_p + 1;
          }
          pcVar18[-1] = cVar8;
          pcVar2 = pcVar18 + -2;
        }
      }
      pcVar18 = pcVar2;
      uVar13 = uVar13 - 1;
    } while (2 < uVar13);
  }
  *pcVar18 = local_278[0];
  if (this->prefix_size != 0) {
    pcVar18[-1] = 0x2d;
  }
  pbVar5 = this->specs;
  uVar13 = 0;
  if (uVar20 <= (uint)pbVar5->width) {
    uVar13 = (uint)pbVar5->width - uVar20;
  }
  bVar10.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container =
       (back_insert_iterator<fmt::v7::detail::buffer<char>_>)
       (this->out).super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container;
  bVar4 = *(byte *)((long)&basic_data<void>::right_padding_shifts +
                   (ulong)((byte)pbVar5->field_0x9 & 0xf));
  if (*(ulong *)((long)bVar10.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container +
                0x18) <
      *(long *)((long)bVar10.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container +
               0x10) + uVar20 + (pbVar5->fill).size_ * uVar13) {
    (*(code *)**(undefined8 **)
                bVar10.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container)
              (bVar10.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container);
  }
  uVar20 = uVar13 >> (bVar4 & 0x3f);
  bVar10 = fill<fmt::v7::detail::buffer_appender<char>,char>(bVar10,uVar20,&pbVar5->fill);
  bVar10 = std::__copy_move<false,false,std::random_access_iterator_tag>::
           __copy_m<char*,fmt::v7::detail::buffer_appender<char>>
                     (pcVar14,pcVar14 + (int)uVar9,bVar10);
  bVar10 = fill<fmt::v7::detail::buffer_appender<char>,char>(bVar10,uVar13 - uVar20,&pbVar5->fill);
  (this->out).super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container =
       (buffer<char> *)bVar10.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container;
  if (local_248.super_buffer<char>.ptr_ != local_248.store_) {
    operator_delete(local_248.super_buffer<char>.ptr_);
  }
LAB_001a08ad:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298._M_dataplus._M_p != &local_298.field_2) {
    operator_delete(local_298._M_dataplus._M_p);
  }
  return;
}

Assistant:

void on_num() {
    std::string groups = grouping<Char>(locale);
    if (groups.empty()) return on_dec();
    auto sep = thousands_sep<Char>(locale);
    if (!sep) return on_dec();
    int num_digits = count_digits(abs_value);
    int size = num_digits, n = num_digits;
    std::string::const_iterator group = groups.cbegin();
    while (group != groups.cend() && n > *group && *group > 0 &&
           *group != max_value<char>()) {
      size += sep_size;
      n -= *group;
      ++group;
    }
    if (group == groups.cend()) size += sep_size * ((n - 1) / groups.back());
    char digits[40];
    format_decimal(digits, abs_value, num_digits);
    basic_memory_buffer<Char> buffer;
    size += static_cast<int>(prefix_size);
    const auto usize = to_unsigned(size);
    buffer.resize(usize);
    basic_string_view<Char> s(&sep, sep_size);
    // Index of a decimal digit with the least significant digit having index 0.
    int digit_index = 0;
    group = groups.cbegin();
    auto p = buffer.data() + size - 1;
    for (int i = num_digits - 1; i > 0; --i) {
      *p-- = static_cast<Char>(digits[i]);
      if (*group <= 0 || ++digit_index % *group != 0 ||
          *group == max_value<char>())
        continue;
      if (group + 1 != groups.cend()) {
        digit_index = 0;
        ++group;
      }
      std::uninitialized_copy(s.data(), s.data() + s.size(),
                              make_checked(p, s.size()));
      p -= s.size();
    }
    *p-- = static_cast<Char>(*digits);
    if (prefix_size != 0) *p = static_cast<Char>('-');
    auto data = buffer.data();
    out = write_padded<align::right>(
        out, specs, usize, usize,
        [=](iterator it) { return copy_str<Char>(data, data + size, it); });
  }